

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

void lay_get_margins_ltrb
               (lay_context *ctx,lay_id item,lay_scalar *l,lay_scalar *t,lay_scalar *r,lay_scalar *b
               )

{
  undefined8 uVar1;
  bool bVar2;
  lay_scalar lStack_56;
  lay_scalar lStack_54;
  lay_scalar lStack_52;
  lay_vec4 margins;
  lay_item_t *pitem;
  lay_scalar *b_local;
  lay_scalar *r_local;
  lay_scalar *t_local;
  lay_scalar *l_local;
  lay_id item_local;
  lay_context *ctx_local;
  
  bVar2 = false;
  if (item != 0xffffffff) {
    bVar2 = item < ctx->count;
  }
  if (!bVar2) {
    __assert_fail("id != LAY_INVALID_ID && id < ctx->count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/rlayout-src/layout.h"
                  ,0x17a,"lay_item_t *lay_get_item(const lay_context *, lay_id)");
  }
  uVar1 = *(undefined8 *)ctx->items[item].margins;
  *l = (lay_scalar)uVar1;
  lStack_56 = (lay_scalar)((ulong)uVar1 >> 0x10);
  *t = lStack_56;
  lStack_54 = (lay_scalar)((ulong)uVar1 >> 0x20);
  *r = lStack_54;
  lStack_52 = (lay_scalar)((ulong)uVar1 >> 0x30);
  *b = lStack_52;
  return;
}

Assistant:

void lay_get_margins_ltrb(
        lay_context *ctx, lay_id item,
        lay_scalar *l, lay_scalar *t, lay_scalar *r, lay_scalar *b)
{
    lay_item_t *pitem = lay_get_item(ctx, item);
    lay_vec4 margins = pitem->margins;
    *l = margins[0];
    *t = margins[1];
    *r = margins[2];
    *b = margins[3];
}